

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool scan_content(TSLexer *lexer,TSSymbol content_symbol,char end_char,uint n_delim,_Bool interp)

{
  int iVar1;
  bool bVar2;
  TSSymbol TVar3;
  uint local_34;
  uint i;
  _Bool is_end_delimiter;
  int32_t next;
  _Bool has_content;
  TSSymbol end_symbol;
  _Bool interp_local;
  uint n_delim_local;
  char end_char_local;
  TSSymbol content_symbol_local;
  TSLexer *lexer_local;
  
  TVar3 = 0xe;
  if (end_char == '\"') {
    TVar3 = 0xf;
  }
  is_end_delimiter = false;
  do {
    iVar1 = lexer->lookahead;
    if (iVar1 == 0) {
      return false;
    }
    mark_end(lexer);
    if ((interp) && ((iVar1 == 0x24 || (iVar1 == 0x5c)))) {
      lexer->result_symbol = content_symbol;
      return is_end_delimiter;
    }
    if (iVar1 == 0x5c) {
      advance(lexer);
      if ((lexer->lookahead == (int)end_char) || (lexer->lookahead == 0x5c)) {
        lexer->result_symbol = content_symbol;
        return is_end_delimiter;
      }
    }
    else {
      bVar2 = true;
      for (local_34 = 1; local_34 <= n_delim; local_34 = local_34 + 1) {
        if (lexer->lookahead != (int)end_char) {
          bVar2 = false;
          break;
        }
        advance(lexer);
      }
      if (bVar2) {
        if (is_end_delimiter != false) {
          lexer->result_symbol = content_symbol;
          return true;
        }
        mark_end(lexer);
        lexer->result_symbol = TVar3;
        return true;
      }
    }
    advance(lexer);
    is_end_delimiter = true;
  } while( true );
}

Assistant:

static bool scan_content(TSLexer *lexer, TSSymbol content_symbol, char end_char, unsigned n_delim, bool interp) {
    TSSymbol end_symbol = (end_char == '"') ? END_STR : END_CMD;
    bool has_content = false;
    int32_t next;
    while ((next = lexer->lookahead)) {
        mark_end(lexer);
        if (interp && (next == '$' || next == '\\')) {
            lexer->result_symbol = content_symbol;
            return has_content;
        } else if (next == '\\') {
            // Parse backslash in raw strings (check escaped delimiters and '\\')
            advance(lexer);
            next = lexer->lookahead;
            if (next == end_char || next == '\\') {
                lexer->result_symbol = content_symbol;
                return has_content;
            }
        } else {
            bool is_end_delimiter = true;
            for (unsigned i = 1; i <= n_delim; i++) {
                if (lexer->lookahead == end_char) {
                    advance(lexer);
                } else {
                    is_end_delimiter = false;
                    break;
                }
            }
            if (is_end_delimiter) {
                if (has_content) {
                    lexer->result_symbol = content_symbol;
                    return true;
                } else {
                    mark_end(lexer);
                    lexer->result_symbol = end_symbol;
                    return true;
                }
            }
        }
        advance(lexer);
        has_content = true;
    }
    return false;
}